

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH65
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  int *piVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  byte bVar7;
  ushort uVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  size_t sVar11;
  size_t sVar12;
  uint32_t *puVar13;
  uint32_t *puVar14;
  BrotliEncoderDictionary *pBVar15;
  void *pvVar16;
  uint64_t uVar17;
  HasherCommon *pHVar18;
  BrotliDictionary *pBVar19;
  undefined8 uVar20;
  int iVar21;
  bool bVar22;
  ulong uVar23;
  size_t sVar24;
  int iVar25;
  uint32_t uVar26;
  uint uVar27;
  uint uVar28;
  void *pvVar29;
  ulong uVar30;
  ulong uVar31;
  void *pvVar32;
  byte bVar33;
  void *pvVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  uint8_t *puVar39;
  ulong uVar40;
  ulong *puVar41;
  bool bVar42;
  uint16_t uVar43;
  uint uVar44;
  ulong uVar45;
  ulong uVar46;
  int iVar47;
  void *pvVar48;
  ulong uVar49;
  long lVar50;
  uint uVar51;
  ulong uVar52;
  void *pvVar53;
  long lVar54;
  uint8_t *puVar55;
  int *piVar56;
  long lVar57;
  ulong uVar58;
  ulong uVar59;
  uint16_t *num;
  ulong *puVar60;
  int last_distance;
  ulong uVar61;
  void *pvVar62;
  uint8_t *s1_orig_2;
  long lVar63;
  ulong uVar64;
  uint8_t *puVar65;
  uint8_t *puVar66;
  uint8_t *s1_orig_1;
  ulong local_188;
  ulong local_178;
  ulong local_168;
  void *local_150;
  size_t local_140;
  int local_134;
  long local_120;
  Command *local_100;
  ulong local_e0;
  ulong local_d8;
  uint local_cc;
  void *local_b8;
  void *local_a8;
  ulong local_78;
  uint8_t *s1_orig;
  
  iVar25 = params->lgwin;
  pvVar5 = (void *)((position - 7) + num_bytes);
  pvVar34 = (void *)position;
  if (7 < num_bytes) {
    pvVar34 = pvVar5;
  }
  sVar11 = params->stream_offset;
  lVar35 = 0x200;
  if (params->quality < 9) {
    lVar35 = 0x40;
  }
  local_140 = *last_insert_len;
  uVar2 = position + num_bytes;
  sVar12 = (params->dictionary).compound.total_size;
  uVar28 = (uint)(hasher->privat)._H35.hb.next_ix;
  if (4 < (int)uVar28) {
    iVar47 = *dist_cache;
    dist_cache[4] = iVar47 + -1;
    dist_cache[5] = iVar47 + 1;
    dist_cache[6] = iVar47 + -2;
    dist_cache[7] = iVar47 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar47 + 3,iVar47 + -3);
    if (10 < uVar28) {
      iVar47 = dist_cache[1];
      dist_cache[10] = iVar47 + -1;
      dist_cache[0xb] = iVar47 + 1;
      dist_cache[0xc] = iVar47 + -2;
      dist_cache[0xd] = iVar47 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar47 + 3,iVar47 + -3);
    }
  }
  if (uVar2 <= position + 8) {
    local_100 = commands;
LAB_00317e20:
    *last_insert_len = (local_140 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_100 - (long)commands >> 4);
    return;
  }
  pvVar6 = (void *)((1L << ((byte)iVar25 & 0x3f)) - 0x10);
  pvVar48 = (void *)(lVar35 + position);
  puVar13 = (hasher->privat)._H5.buckets_;
  puVar14 = (hasher->privat)._H6.buckets_;
  lVar36 = sVar12 + 1;
  lVar4 = position - 1;
  local_100 = commands;
  pvVar32 = (void *)position;
LAB_0031658f:
  pvVar53 = pvVar6;
  if (pvVar32 < pvVar6) {
    pvVar53 = pvVar32;
  }
  pvVar62 = (void *)(sVar11 + (long)pvVar32);
  if (pvVar6 <= (void *)(sVar11 + (long)pvVar32)) {
    pvVar62 = pvVar6;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_cc = 0;
    local_78 = 0;
  }
  else {
    if (pvVar32 == (void *)0x0) {
      local_78 = 0;
LAB_003165e9:
      uVar37 = 0;
    }
    else {
      local_78 = (ulong)ringbuffer[(long)pvVar32 - 1U & ringbuffer_mask];
      if (pvVar32 == (void *)0x1) goto LAB_003165e9;
      uVar37 = (ulong)ringbuffer[(long)pvVar32 - 2U & ringbuffer_mask];
    }
    local_cc = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[uVar37 + 0x100] | literal_context_lut[local_78]];
  }
  uVar37 = uVar2 - (long)pvVar32;
  pBVar15 = (params->dictionary).contextual.dict[local_cc];
  pvVar16 = (void *)(params->dist).max_distance;
  uVar61 = (ulong)pvVar32 & ringbuffer_mask;
  uVar45 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
  if (uVar45 != 0) {
    puVar65 = ringbuffer + uVar61;
    local_178 = 0x7e4;
    uVar59 = 0;
    uVar52 = 0;
    local_168 = 0;
    local_b8 = (void *)0x0;
LAB_0031667d:
    pvVar29 = (void *)(long)dist_cache[uVar52];
    if (((pvVar29 <= pvVar53) && ((void *)((long)pvVar32 - (long)pvVar29) < pvVar32)) &&
       (uVar59 + uVar61 <= ringbuffer_mask)) {
      uVar38 = (ulong)((long)pvVar32 - (long)pvVar29) & ringbuffer_mask;
      uVar64 = uVar38 + uVar59;
      if ((ringbuffer_mask < uVar64) || (ringbuffer[uVar59 + uVar61] != ringbuffer[uVar64]))
      goto LAB_0031673e;
      puVar39 = ringbuffer + uVar38;
      puVar55 = puVar39;
      uVar64 = uVar37;
      puVar66 = puVar65;
      if (7 < uVar37) {
        lVar54 = 0;
        lVar63 = 0;
LAB_003166df:
        if (*(ulong *)(puVar65 + lVar54) == *(ulong *)(puVar39 + lVar54)) goto code_r0x003166ec;
        uVar38 = *(ulong *)(puVar39 + lVar54) ^ *(ulong *)(puVar65 + lVar54);
        uVar64 = 0;
        if (uVar38 != 0) {
          for (; (uVar38 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
          }
        }
        uVar64 = (uVar64 >> 3 & 0x1fffffff) - lVar63;
        goto LAB_0031676f;
      }
      goto LAB_00316717;
    }
    goto LAB_0031673e;
  }
  local_178 = 0x7e4;
  local_b8 = (void *)0x0;
  local_168 = 0;
  uVar59 = 0;
LAB_003167ff:
  puVar3 = (ulong *)(ringbuffer + uVar61);
  uVar45 = (hasher->privat)._H5.block_size_;
  uVar17 = (hasher->privat)._H6.hash_mul_;
  uVar38 = *(long *)(ringbuffer + uVar61) * uVar17 >> 0x31;
  lVar54 = uVar38 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
  uVar8 = *(ushort *)((long)puVar13 + uVar38 * 2);
  uVar64 = (ulong)uVar8;
  uVar52 = 0;
  if (uVar45 <= uVar64) {
    uVar52 = uVar64 - uVar45;
  }
  uVar28 = (hasher->privat)._H6.block_mask_;
  uVar44 = (uint)ringbuffer_mask;
  if (uVar52 < uVar64) {
    uVar30 = uVar37 - 4;
    piVar1 = (int *)((long)puVar3 + 4);
LAB_0031688e:
    uVar64 = uVar64 - 1;
    pvVar29 = (void *)((long)pvVar32 - (ulong)puVar14[lVar54 + (ulong)((uint)uVar64 & uVar28)]);
    if (pvVar29 <= pvVar53) {
      if (uVar59 + uVar61 <= ringbuffer_mask) {
        uVar46 = (ulong)(puVar14[lVar54 + (ulong)((uint)uVar64 & uVar28)] & uVar44);
        if (((ringbuffer_mask < uVar59 + uVar46) ||
            (ringbuffer[uVar59 + uVar61] != ringbuffer[uVar59 + uVar46])) ||
           (*(int *)(ringbuffer + uVar46) != (int)*(long *)(ringbuffer + uVar61)))
        goto LAB_0031696a;
        puVar55 = ringbuffer + uVar46 + 4;
        uVar46 = uVar30;
        piVar56 = piVar1;
        puVar65 = puVar55;
        if (7 < uVar30) {
          lVar63 = 0;
LAB_0031690c:
          if (*(ulong *)((long)piVar1 + lVar63) == *(ulong *)(puVar55 + lVar63))
          goto code_r0x0031691f;
          uVar58 = *(ulong *)(puVar55 + lVar63) ^ *(ulong *)((long)piVar1 + lVar63);
          uVar46 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          lVar63 = (uVar46 >> 3 & 0x1fffffff) + lVar63;
          goto LAB_00316995;
        }
        goto LAB_0031693b;
      }
      goto LAB_0031696a;
    }
  }
LAB_003169ce:
  puVar14[lVar54 + (ulong)(uVar28 & uVar8)] = (uint32_t)pvVar32;
  *(ushort *)((long)puVar13 + uVar38 * 2) = uVar8 + 1;
  if (local_178 == 0x7e4) {
    pHVar18 = (hasher->privat)._H6.common_;
    uVar59 = pHVar18->dict_num_lookups;
    local_178 = pHVar18->dict_num_matches;
    if (uVar59 >> 7 <= local_178) {
      uVar52 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar65 = pBVar15->hash_table_lengths;
      uVar61 = 0x7e4;
      local_134 = 0;
      bVar42 = true;
LAB_00316b14:
      uVar59 = uVar59 + 1;
      pHVar18->dict_num_lookups = uVar59;
      bVar33 = puVar65[uVar52];
      uVar64 = (ulong)bVar33;
      if ((uVar64 != 0) && (uVar64 <= uVar37)) {
        pBVar19 = pBVar15->words;
        puVar41 = (ulong *)(pBVar19->data +
                           (ulong)pBVar19->offsets_by_length[uVar64] +
                           pBVar15->hash_table_words[uVar52] * uVar64);
        puVar60 = puVar3;
        uVar38 = uVar64;
        if (7 < bVar33) {
          lVar54 = 0;
LAB_00316b6e:
          if (*puVar41 == *puVar60) goto code_r0x00316b79;
          uVar30 = *puVar60 ^ *puVar41;
          uVar38 = 0;
          if (uVar30 != 0) {
            for (; (uVar30 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
            }
          }
          uVar38 = (uVar38 >> 3 & 0x1fffffff) - lVar54;
          goto LAB_00316be1;
        }
        goto LAB_00316ba1;
      }
      goto LAB_00316caf;
    }
    local_134 = 0;
    uVar61 = 0x7e4;
  }
  else {
    local_134 = 0;
    uVar61 = local_178;
  }
LAB_00316a54:
  local_178 = uVar61;
  local_e0 = local_168;
  if (0x1f < uVar37) {
    pvVar62 = (hasher->privat)._H35.ha_common.extra[3];
    if (pvVar62 <= pvVar32) {
      uVar28 = (hasher->privat)._H65.hb.state;
      uVar26 = (hasher->privat)._H65.hb.factor;
      uVar9 = (hasher->privat)._H65.hb.factor_remove;
LAB_00316d18:
      uVar51 = uVar28 & 0x3fffffff;
      bVar33 = ringbuffer[(ulong)pvVar62 & ringbuffer_mask];
      bVar7 = ringbuffer[(long)pvVar62 + 0x20U & ringbuffer_mask];
      if (uVar51 < 0x1000000) {
        pvVar29 = (hasher->privat)._H35.ha_common.extra[2];
        uVar27 = *(uint *)((long)pvVar29 + (ulong)uVar51 * 4);
        *(int *)((long)pvVar29 + (ulong)uVar51 * 4) = (int)pvVar62;
        if ((pvVar62 == pvVar32) && (uVar27 != 0xffffffff)) {
          uVar51 = (uint32_t)pvVar32 - uVar27;
          if ((void *)(ulong)uVar51 <= pvVar53) {
            puVar65 = ringbuffer + (uVar27 & uVar44);
            lVar63 = 0;
            lVar54 = 0;
LAB_00316da7:
            lVar57 = lVar54;
            if (*(ulong *)((long)puVar3 + lVar63) == *(ulong *)(puVar65 + lVar63))
            goto code_r0x00316dbb;
            uVar59 = *(ulong *)(puVar65 + lVar63) ^ *(ulong *)((long)puVar3 + lVar63);
            uVar61 = 0;
            if (uVar59 != 0) {
              for (; (uVar59 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
              }
            }
            uVar61 = lVar63 + (uVar61 >> 3 & 0x1fffffff);
            goto LAB_00316e4e;
          }
        }
      }
      goto LAB_00316d76;
    }
    goto LAB_00316ecc;
  }
  goto LAB_00316edc;
code_r0x003166ec:
  lVar54 = lVar54 + 8;
  lVar57 = uVar37 + lVar63;
  lVar63 = lVar63 + -8;
  if (lVar57 - 8U < 8) goto code_r0x00316706;
  goto LAB_003166df;
code_r0x00316706:
  puVar55 = puVar39 + -lVar63;
  puVar66 = puVar65 + -lVar63;
  uVar64 = lVar63 + uVar37;
LAB_00316717:
  if (uVar64 != 0) {
    uVar38 = 0;
    do {
      uVar30 = uVar38;
      if (puVar55[uVar38] != puVar66[uVar38]) break;
      uVar38 = uVar38 + 1;
      uVar30 = uVar64;
    } while (uVar64 != uVar38);
    puVar55 = puVar55 + uVar30;
  }
  uVar64 = (long)puVar55 - (long)puVar39;
LAB_0031676f:
  if (((2 < uVar64) || ((uVar52 < 2 && (uVar64 == 2)))) &&
     (uVar38 = uVar64 * 0x87 + 0x78f, local_178 < uVar38)) {
    if (uVar52 != 0) {
      uVar38 = uVar38 - ((0x1ca10U >> ((byte)uVar52 & 0xe) & 0xe) + 0x27);
    }
    if (local_178 < uVar38) {
      local_b8 = pvVar29;
      uVar59 = uVar64;
      local_178 = uVar38;
      local_168 = uVar64;
    }
  }
LAB_0031673e:
  uVar52 = uVar52 + 1;
  if (uVar52 == uVar45) goto LAB_003167ff;
  goto LAB_0031667d;
code_r0x0031691f:
  uVar46 = uVar46 - 8;
  lVar63 = lVar63 + 8;
  if (uVar46 < 8) goto code_r0x0031692d;
  goto LAB_0031690c;
code_r0x0031692d:
  puVar65 = puVar55 + lVar63;
  piVar56 = (int *)(lVar63 + (long)piVar1);
LAB_0031693b:
  if (uVar46 != 0) {
    uVar58 = 0;
    do {
      uVar40 = uVar58;
      if (puVar65[uVar58] != *(uint8_t *)((long)piVar56 + uVar58)) break;
      uVar58 = uVar58 + 1;
      uVar40 = uVar46;
    } while (uVar46 != uVar58);
    puVar65 = puVar65 + uVar40;
  }
  lVar63 = (long)puVar65 - (long)puVar55;
LAB_00316995:
  uVar46 = lVar63 + 4;
  iVar25 = 0x1f;
  if ((uint)pvVar29 != 0) {
    for (; (uint)pvVar29 >> iVar25 == 0; iVar25 = iVar25 + -1) {
    }
  }
  uVar58 = (ulong)(iVar25 * -0x1e + 0x780) + uVar46 * 0x87;
  if (local_178 < uVar58) {
    local_b8 = pvVar29;
    uVar59 = uVar46;
    local_178 = uVar58;
    local_168 = uVar46;
  }
LAB_0031696a:
  if (uVar64 <= uVar52) goto LAB_003169ce;
  goto LAB_0031688e;
code_r0x00316b79:
  puVar41 = puVar41 + 1;
  puVar60 = puVar60 + 1;
  lVar63 = uVar64 + lVar54;
  lVar54 = lVar54 + -8;
  if (lVar63 - 8U < 8) goto code_r0x00316b93;
  goto LAB_00316b6e;
code_r0x00316b93:
  uVar38 = lVar54 + uVar64;
  if (lVar54 + uVar64 != 0) {
LAB_00316ba1:
    uVar30 = 0;
    do {
      uVar46 = uVar30;
      if (*(char *)((long)puVar60 + uVar30) != *(char *)((long)puVar41 + uVar30)) break;
      uVar30 = uVar30 + 1;
      uVar46 = uVar38;
    } while (uVar38 != uVar30);
    puVar60 = (ulong *)((long)puVar60 + uVar46);
  }
  uVar38 = (long)puVar60 - (long)puVar3;
LAB_00316be1:
  if (((uVar38 != 0) && (uVar64 < pBVar15->cutoffTransformsCount + uVar38)) &&
     (pvVar29 = (void *)((long)pvVar62 +
                        ((ulong)((uint)(pBVar15->cutoffTransforms >>
                                       ((char)(uVar64 - uVar38) * '\x06' & 0x3fU)) & 0x3f) +
                         (uVar64 - uVar38) * 4 << (pBVar19->size_bits_by_length[uVar64] & 0x3f)) +
                        (ulong)pBVar15->hash_table_words[uVar52] + lVar36), pvVar29 <= pvVar16)) {
    iVar25 = 0x1f;
    if ((uint)pvVar29 != 0) {
      for (; (uint)pvVar29 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    uVar64 = (uVar38 * 0x87 - (ulong)(uint)(iVar25 * 0x1e)) + 0x780;
    if (uVar61 <= uVar64) {
      local_134 = (uint)bVar33 - (int)uVar38;
      local_178 = local_178 + 1;
      pHVar18->dict_num_matches = local_178;
      uVar61 = uVar64;
      local_168 = uVar38;
      local_b8 = pvVar29;
    }
  }
LAB_00316caf:
  uVar52 = uVar52 + 1;
  bVar22 = !bVar42;
  bVar42 = false;
  if (bVar22) goto LAB_00316a54;
  goto LAB_00316b14;
code_r0x00316dbb:
  lVar63 = lVar63 + 8;
  lVar54 = lVar57 + -8;
  if ((uVar37 + lVar57) - 8 < 8) goto code_r0x00316dd5;
  goto LAB_00316da7;
code_r0x00316dd5:
  if (uVar37 - lVar63 == 0) {
    puVar55 = puVar65 + lVar63;
  }
  else {
    puVar55 = puVar65 + (uVar37 - lVar63) + lVar63;
    uVar61 = 8 - lVar57;
    do {
      if (puVar65[uVar61] != *(uint8_t *)((long)puVar3 + uVar61)) {
        puVar55 = puVar65 + uVar61;
        break;
      }
      uVar61 = uVar61 + 1;
    } while (uVar37 != uVar61);
  }
  uVar61 = (long)puVar55 - (long)puVar65;
LAB_00316e4e:
  if ((3 < uVar61) && (local_e0 < uVar61)) {
    iVar25 = 0x1f;
    if (uVar51 != 0) {
      for (; uVar51 >> iVar25 == 0; iVar25 = iVar25 + -1) {
      }
    }
    uVar59 = (ulong)(iVar25 * -0x1e + 0x780) + uVar61 * 0x87;
    if (local_178 < uVar59) {
      local_134 = 0;
      local_178 = uVar59;
      local_e0 = uVar61;
      local_b8 = (void *)(ulong)uVar51;
    }
  }
LAB_00316d76:
  uVar28 = ~(uint)bVar33 * uVar9 + (uint)bVar7 + uVar28 * uVar26 + 1;
  pvVar62 = (void *)((long)pvVar62 + 1);
  if (pvVar32 < pvVar62) goto LAB_00316ea8;
  goto LAB_00316d18;
LAB_00316ea8:
  (hasher->privat)._H65.hb.state = uVar28;
LAB_00316ecc:
  (hasher->privat)._H35.ha_common.extra[3] = (void *)((long)pvVar32 + 1);
LAB_00316edc:
  if (0x7e4 < local_178) {
    uVar61 = local_140 + 4;
    local_120 = (lVar4 + num_bytes) - (long)pvVar32;
    iVar25 = 0;
LAB_00316f21:
    uVar59 = uVar37 - 1;
    uVar52 = local_e0 - 1;
    if (uVar59 <= local_e0 - 1) {
      uVar52 = uVar59;
    }
    if (4 < params->quality) {
      uVar52 = 0;
    }
    pvVar48 = (void *)((long)pvVar32 + 1);
    pvVar53 = pvVar6;
    if (pvVar48 < pvVar6) {
      pvVar53 = pvVar48;
    }
    local_a8 = (void *)((long)pvVar32 + sVar11 + 1);
    if (pvVar6 <= local_a8) {
      local_a8 = pvVar6;
    }
    if ((params->dictionary).contextual.context_based != 0) {
      local_cc = (uint)(params->dictionary).contextual.context_map
                       [literal_context_lut[local_78 + 0x100] |
                        literal_context_lut[ringbuffer[(ulong)pvVar32 & ringbuffer_mask]]];
      local_78 = (ulong)ringbuffer[(ulong)pvVar32 & ringbuffer_mask];
    }
    pBVar15 = (params->dictionary).contextual.dict[local_cc];
    uVar38 = (ulong)pvVar48 & ringbuffer_mask;
    uVar64 = (ulong)(hasher->privat)._H6.num_last_distances_to_check_;
    if (uVar64 != 0) {
      puVar65 = ringbuffer + uVar38;
      local_188 = 0x7e4;
      uVar46 = 0;
      uVar30 = 0;
      local_150 = (void *)0x0;
LAB_0031701b:
      pvVar62 = (void *)(long)dist_cache[uVar46];
      if (((pvVar62 <= pvVar53) && ((void *)((long)pvVar48 - (long)pvVar62) < pvVar48)) &&
         (uVar52 + uVar38 <= ringbuffer_mask)) {
        uVar40 = (ulong)((long)pvVar48 - (long)pvVar62) & ringbuffer_mask;
        uVar58 = uVar40 + uVar52;
        if ((ringbuffer_mask < uVar58) || (ringbuffer[uVar52 + uVar38] != ringbuffer[uVar58]))
        goto LAB_003170dd;
        puVar39 = ringbuffer + uVar40;
        puVar55 = puVar65;
        puVar66 = puVar39;
        uVar58 = uVar59;
        if (7 < uVar59) {
          lVar54 = 0;
          lVar63 = 0;
LAB_0031707e:
          if (*(ulong *)(puVar65 + lVar54) == *(ulong *)(puVar39 + lVar54)) goto code_r0x0031708b;
          uVar40 = *(ulong *)(puVar39 + lVar54) ^ *(ulong *)(puVar65 + lVar54);
          uVar58 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
            }
          }
          uVar58 = (uVar58 >> 3 & 0x1fffffff) - lVar63;
          goto LAB_00317110;
        }
        goto LAB_003170b6;
      }
      goto LAB_003170dd;
    }
    local_188 = 0x7e4;
    local_150 = (void *)0x0;
    uVar30 = 0;
LAB_00317189:
    puVar3 = (ulong *)(ringbuffer + uVar38);
    uVar58 = *(long *)(ringbuffer + uVar38) * uVar17 >> 0x31;
    lVar54 = uVar58 << (*(byte *)((long)&hasher->privat + 0x1c) & 0x3f);
    uVar8 = *(ushort *)((long)puVar13 + uVar58 * 2);
    uVar46 = (ulong)uVar8;
    uVar64 = 0;
    if (uVar45 <= uVar46) {
      uVar64 = uVar46 - uVar45;
    }
    uVar28 = (hasher->privat)._H6.block_mask_;
    if (uVar64 < uVar46) {
      uVar40 = uVar37 - 5;
      piVar1 = (int *)((long)puVar3 + 4);
LAB_00317219:
      uVar46 = uVar46 - 1;
      pvVar62 = (void *)((long)pvVar48 - (ulong)puVar14[lVar54 + (ulong)((uint)uVar46 & uVar28)]);
      if (pvVar62 <= pvVar53) {
        if (uVar52 + uVar38 <= ringbuffer_mask) {
          uVar31 = (ulong)(puVar14[lVar54 + (ulong)((uint)uVar46 & uVar28)] & uVar44);
          if (((ringbuffer_mask < uVar31 + uVar52) ||
              (ringbuffer[uVar52 + uVar38] != ringbuffer[uVar31 + uVar52])) ||
             (*(int *)(ringbuffer + uVar31) != (int)*(long *)(ringbuffer + uVar38)))
          goto LAB_0031730c;
          puVar55 = ringbuffer + uVar31 + 4;
          uVar31 = uVar40;
          piVar56 = piVar1;
          puVar65 = puVar55;
          if (7 < uVar40) {
            lVar63 = 0;
LAB_003172ac:
            if (*(ulong *)((long)piVar1 + lVar63) == *(ulong *)(puVar55 + lVar63))
            goto code_r0x003172b9;
            uVar49 = *(ulong *)(puVar55 + lVar63) ^ *(ulong *)((long)piVar1 + lVar63);
            uVar31 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
              }
            }
            lVar63 = (uVar31 >> 3 & 0x1fffffff) + lVar63;
            goto LAB_00317341;
          }
          goto LAB_003172d3;
        }
        goto LAB_0031730c;
      }
    }
LAB_0031737b:
    puVar14[lVar54 + (ulong)(uVar28 & uVar8)] = (uint32_t)pvVar48;
    *(ushort *)((long)puVar13 + uVar58 * 2) = uVar8 + 1;
    if (local_188 == 0x7e4) {
      pHVar18 = (hasher->privat)._H6.common_;
      uVar52 = pHVar18->dict_num_lookups;
      local_d8 = pHVar18->dict_num_matches;
      if (uVar52 >> 7 <= local_d8) {
        uVar64 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar65 = pBVar15->hash_table_lengths;
        iVar47 = 0;
        local_188 = 0x7e4;
        bVar42 = true;
LAB_003174a9:
        uVar52 = uVar52 + 1;
        pHVar18->dict_num_lookups = uVar52;
        bVar33 = puVar65[uVar64];
        uVar38 = (ulong)bVar33;
        if ((uVar38 != 0) && (uVar38 <= uVar59)) {
          pBVar19 = pBVar15->words;
          puVar41 = (ulong *)(pBVar19->data +
                             (ulong)pBVar19->offsets_by_length[uVar38] +
                             pBVar15->hash_table_words[uVar64] * uVar38);
          puVar60 = puVar3;
          uVar46 = uVar38;
          if (7 < bVar33) {
            lVar54 = 0;
LAB_0031751d:
            if (*puVar41 == *puVar60) goto code_r0x00317528;
            uVar58 = *puVar60 ^ *puVar41;
            uVar46 = 0;
            if (uVar58 != 0) {
              for (; (uVar58 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar46 = (uVar46 >> 3 & 0x1fffffff) - lVar54;
            goto LAB_0031758e;
          }
          goto LAB_00317551;
        }
        goto LAB_003174ca;
      }
      iVar47 = 0;
      local_188 = 0x7e4;
    }
    else {
      iVar47 = 0;
    }
LAB_003173f8:
    if (0x1f < uVar59) {
      pvVar62 = (hasher->privat)._H35.ha_common.extra[3];
      if (pvVar62 <= pvVar48) {
        uVar28 = (hasher->privat)._H65.hb.state;
        uVar26 = (hasher->privat)._H65.hb.factor;
        uVar9 = (hasher->privat)._H65.hb.factor_remove;
LAB_0031767b:
        uVar51 = uVar28 & 0x3fffffff;
        bVar33 = ringbuffer[(ulong)pvVar62 & ringbuffer_mask];
        bVar7 = ringbuffer[(long)pvVar62 + 0x20U & ringbuffer_mask];
        if (uVar51 < 0x1000000) {
          pvVar29 = (hasher->privat)._H35.ha_common.extra[2];
          uVar27 = *(uint *)((long)pvVar29 + (ulong)uVar51 * 4);
          *(int *)((long)pvVar29 + (ulong)uVar51 * 4) = (int)pvVar62;
          if ((pvVar62 == pvVar48) && (uVar27 != 0xffffffff)) {
            uVar51 = (uint32_t)pvVar48 - uVar27;
            if ((void *)(ulong)uVar51 <= pvVar53) {
              puVar65 = ringbuffer + (uVar27 & uVar44);
              lVar63 = 0;
              lVar54 = 0;
LAB_003176de:
              lVar57 = lVar54;
              if (*(ulong *)((long)puVar3 + lVar57) == *(ulong *)(puVar65 + lVar57))
              goto code_r0x003176f0;
              uVar64 = *(ulong *)(puVar65 + lVar57) ^ *(ulong *)((long)puVar3 + lVar57);
              uVar52 = 0;
              if (uVar64 != 0) {
                for (; (uVar64 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
                }
              }
              uVar52 = (uVar52 >> 3 & 0x1fffffff) + lVar57;
              goto LAB_003177b6;
            }
          }
        }
        goto LAB_0031772e;
      }
      goto LAB_0031782f;
    }
    goto LAB_00317840;
  }
  local_140 = local_140 + 1;
  position = (long)pvVar32 + 1;
  if (pvVar48 < position) {
    if ((void *)((ulong)(uint)((int)lVar35 * 4) + (long)pvVar48) < position) {
      pvVar53 = (void *)((long)pvVar32 + 0x11U);
      if (pvVar5 <= (void *)((long)pvVar32 + 0x11U)) {
        pvVar53 = pvVar5;
      }
      if (position < pvVar53) {
        uVar28 = (hasher->privat)._H6.block_mask_;
        uVar10 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        do {
          uVar37 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar17 >> 0x31;
          uVar8 = *(ushort *)((long)puVar13 + uVar37 * 2);
          *(ushort *)((long)puVar13 + uVar37 * 2) = uVar8 + 1;
          puVar14[(uVar37 << ((byte)uVar10 & 0x3f)) + (ulong)(uVar28 & uVar8)] = (uint32_t)position;
          local_140 = local_140 + 4;
          position = position + 4;
        } while (position < pvVar53);
      }
    }
    else {
      pvVar53 = (void *)((long)pvVar32 + 9U);
      if (pvVar5 <= (void *)((long)pvVar32 + 9U)) {
        pvVar53 = pvVar5;
      }
      if (position < pvVar53) {
        uVar28 = (hasher->privat)._H6.block_mask_;
        uVar10 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
        do {
          uVar37 = *(long *)(ringbuffer + (position & ringbuffer_mask)) * uVar17 >> 0x31;
          uVar8 = *(ushort *)((long)puVar13 + uVar37 * 2);
          *(ushort *)((long)puVar13 + uVar37 * 2) = uVar8 + 1;
          puVar14[(uVar37 << ((byte)uVar10 & 0x3f)) + (ulong)(uVar28 & uVar8)] = (uint32_t)position;
          local_140 = local_140 + 2;
          position = position + 2;
        } while (position < pvVar53);
      }
    }
  }
  goto LAB_00317d84;
code_r0x0031708b:
  lVar54 = lVar54 + 8;
  lVar57 = local_120 + lVar63;
  lVar63 = lVar63 + -8;
  if (lVar57 - 8U < 8) goto code_r0x003170a5;
  goto LAB_0031707e;
code_r0x003170a5:
  puVar66 = puVar39 + -lVar63;
  puVar55 = puVar65 + -lVar63;
  uVar58 = lVar63 + local_120;
LAB_003170b6:
  if (uVar58 != 0) {
    uVar40 = 0;
    do {
      uVar31 = uVar40;
      if (puVar66[uVar40] != puVar55[uVar40]) break;
      uVar40 = uVar40 + 1;
      uVar31 = uVar58;
    } while (uVar58 != uVar40);
    puVar66 = puVar66 + uVar31;
  }
  uVar58 = (long)puVar66 - (long)puVar39;
LAB_00317110:
  if (((2 < uVar58) || ((uVar46 < 2 && (uVar58 == 2)))) &&
     (uVar40 = uVar58 * 0x87 + 0x78f, local_188 < uVar40)) {
    if (uVar46 != 0) {
      uVar40 = uVar40 - ((0x1ca10U >> ((byte)uVar46 & 0xe) & 0xe) + 0x27);
    }
    if (local_188 < uVar40) {
      local_150 = pvVar62;
      uVar52 = uVar58;
      uVar30 = uVar58;
      local_188 = uVar40;
    }
  }
LAB_003170dd:
  uVar46 = uVar46 + 1;
  if (uVar46 == uVar64) goto LAB_00317189;
  goto LAB_0031701b;
code_r0x003172b9:
  uVar31 = uVar31 - 8;
  lVar63 = lVar63 + 8;
  if (uVar31 < 8) goto code_r0x003172c7;
  goto LAB_003172ac;
code_r0x003172c7:
  puVar65 = puVar55 + lVar63;
  piVar56 = (int *)(lVar63 + (long)piVar1);
LAB_003172d3:
  if (uVar31 != 0) {
    uVar49 = 0;
    do {
      uVar23 = uVar49;
      if (puVar65[uVar49] != *(uint8_t *)((long)piVar56 + uVar49)) break;
      uVar49 = uVar49 + 1;
      uVar23 = uVar31;
    } while (uVar31 != uVar49);
    puVar65 = puVar65 + uVar23;
  }
  lVar63 = (long)puVar65 - (long)puVar55;
LAB_00317341:
  uVar31 = lVar63 + 4;
  iVar47 = 0x1f;
  if ((uint)pvVar62 != 0) {
    for (; (uint)pvVar62 >> iVar47 == 0; iVar47 = iVar47 + -1) {
    }
  }
  uVar49 = (ulong)(iVar47 * -0x1e + 0x780) + uVar31 * 0x87;
  if (local_188 < uVar49) {
    local_150 = pvVar62;
    uVar52 = uVar31;
    uVar30 = uVar31;
    local_188 = uVar49;
  }
LAB_0031730c:
  if (uVar46 <= uVar64) goto LAB_0031737b;
  goto LAB_00317219;
code_r0x00317528:
  puVar41 = puVar41 + 1;
  puVar60 = puVar60 + 1;
  lVar63 = uVar38 + lVar54;
  lVar54 = lVar54 + -8;
  if (lVar63 - 8U < 8) goto code_r0x00317542;
  goto LAB_0031751d;
code_r0x00317542:
  uVar46 = lVar54 + uVar38;
  if (lVar54 + uVar38 != 0) {
LAB_00317551:
    uVar58 = 0;
    do {
      uVar40 = uVar58;
      if (*(char *)((long)puVar60 + uVar58) != *(char *)((long)puVar41 + uVar58)) break;
      uVar58 = uVar58 + 1;
      uVar40 = uVar46;
    } while (uVar46 != uVar58);
    puVar60 = (ulong *)((long)puVar60 + uVar40);
  }
  uVar46 = (long)puVar60 - (long)puVar3;
LAB_0031758e:
  if (((uVar46 != 0) && (uVar38 < pBVar15->cutoffTransformsCount + uVar46)) &&
     (pvVar62 = (void *)((long)local_a8 +
                        ((ulong)((uint)(pBVar15->cutoffTransforms >>
                                       ((char)(uVar38 - uVar46) * '\x06' & 0x3fU)) & 0x3f) +
                         (uVar38 - uVar46) * 4 << (pBVar19->size_bits_by_length[uVar38] & 0x3f)) +
                        (ulong)pBVar15->hash_table_words[uVar64] + lVar36), pvVar62 <= pvVar16)) {
    iVar21 = 0x1f;
    if ((uint)pvVar62 != 0) {
      for (; (uint)pvVar62 >> iVar21 == 0; iVar21 = iVar21 + -1) {
      }
    }
    uVar38 = (uVar46 * 0x87 - (ulong)(uint)(iVar21 * 0x1e)) + 0x780;
    if (local_188 <= uVar38) {
      iVar47 = (uint)bVar33 - (int)uVar46;
      local_d8 = local_d8 + 1;
      pHVar18->dict_num_matches = local_d8;
      local_188 = uVar38;
      uVar30 = uVar46;
      local_150 = pvVar62;
    }
  }
LAB_003174ca:
  uVar64 = uVar64 + 1;
  bVar22 = !bVar42;
  bVar42 = false;
  if (bVar22) goto LAB_003173f8;
  goto LAB_003174a9;
code_r0x003176f0:
  lVar54 = lVar57 + 8;
  lVar50 = uVar37 + lVar63;
  lVar63 = lVar63 + -8;
  if (lVar50 - 9U < 8) goto code_r0x0031770a;
  goto LAB_003176de;
code_r0x0031770a:
  puVar55 = puVar65 + lVar54;
  if (lVar57 + 9U != uVar37) {
    puVar66 = (uint8_t *)((long)puVar3 + lVar54);
    lVar54 = lVar63 + uVar37 + -1;
    puVar39 = puVar55;
    do {
      puVar55 = puVar39;
      if (*puVar39 != *puVar66) break;
      puVar66 = puVar66 + 1;
      puVar39 = puVar39 + 1;
      lVar54 = lVar54 + -1;
      puVar55 = puVar65 + (uVar37 - 1);
    } while (lVar54 != 0);
  }
  uVar52 = (long)puVar55 - (long)puVar65;
LAB_003177b6:
  if ((3 < uVar52) && (uVar30 < uVar52)) {
    iVar21 = 0x1f;
    if (uVar51 != 0) {
      for (; uVar51 >> iVar21 == 0; iVar21 = iVar21 + -1) {
      }
    }
    uVar64 = (ulong)(iVar21 * -0x1e + 0x780) + uVar52 * 0x87;
    if (local_188 < uVar64) {
      iVar47 = 0;
      uVar30 = uVar52;
      local_188 = uVar64;
      local_150 = (void *)(ulong)uVar51;
    }
  }
LAB_0031772e:
  uVar28 = ~(uint)bVar33 * uVar9 + (uint)bVar7 + uVar28 * uVar26 + 1;
  pvVar62 = (void *)((long)pvVar62 + 1);
  if (pvVar48 < pvVar62) goto LAB_00317813;
  goto LAB_0031767b;
LAB_00317813:
  (hasher->privat)._H65.hb.state = uVar28;
LAB_0031782f:
  (hasher->privat)._H35.ha_common.extra[3] = (void *)((long)pvVar32 + 2);
LAB_00317840:
  if (local_188 < local_178 + 0xaf) {
    pvVar48 = pvVar32;
    uVar30 = local_e0;
    local_150 = local_b8;
    sVar24 = local_140;
    local_a8 = (void *)((long)pvVar32 + sVar11);
    iVar47 = local_134;
    if (pvVar6 <= (void *)((long)pvVar32 + sVar11)) {
      local_a8 = pvVar6;
    }
    goto LAB_00317992;
  }
  sVar24 = uVar61;
  if (iVar25 == 3) goto LAB_00317992;
  local_140 = local_140 + 1;
  iVar25 = iVar25 + 1;
  uVar52 = (long)pvVar32 + 9;
  local_120 = local_120 + -1;
  local_178 = local_188;
  pvVar32 = pvVar48;
  uVar37 = uVar59;
  local_e0 = uVar30;
  sVar24 = local_140;
  local_134 = iVar47;
  local_b8 = local_150;
  if (uVar2 <= uVar52) goto LAB_00317992;
  goto LAB_00316f21;
LAB_00317992:
  local_140 = sVar24;
  local_a8 = (void *)((long)local_a8 + sVar12);
  if (local_a8 < local_150) {
LAB_003179b0:
    uVar37 = (long)local_150 + 0xf;
LAB_003179b4:
    if ((local_150 <= local_a8) && (uVar37 != 0)) {
      dist_cache[3] = dist_cache[2];
      uVar20 = *(undefined8 *)dist_cache;
      *(undefined8 *)(dist_cache + 1) = uVar20;
      iVar25 = (int)local_150;
      *dist_cache = iVar25;
      uVar28 = (uint)(hasher->privat)._H35.hb.next_ix;
      if (4 < (int)uVar28) {
        dist_cache[4] = iVar25 + -1;
        dist_cache[5] = iVar25 + 1;
        dist_cache[6] = iVar25 + -2;
        dist_cache[7] = iVar25 + 2;
        dist_cache[8] = iVar25 + -3;
        dist_cache[9] = iVar25 + 3;
        if (10 < uVar28) {
          iVar25 = (int)uVar20;
          dist_cache[10] = iVar25 + -1;
          dist_cache[0xb] = iVar25 + 1;
          dist_cache[0xc] = iVar25 + -2;
          dist_cache[0xd] = iVar25 + 2;
          *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar25 + 3,iVar25 + -3);
        }
      }
    }
  }
  else {
    if (local_150 != (void *)(long)*dist_cache) {
      uVar37 = 1;
      if (local_150 != (void *)(long)dist_cache[1]) {
        uVar37 = (long)local_150 + (3 - (long)*dist_cache);
        if (uVar37 < 7) {
          bVar33 = (byte)((int)uVar37 << 2);
          uVar28 = 0x9750468;
        }
        else {
          uVar37 = (long)local_150 + (3 - (long)dist_cache[1]);
          if (6 < uVar37) {
            uVar37 = 2;
            if ((local_150 != (void *)(long)dist_cache[2]) &&
               (uVar37 = 3, local_150 != (void *)(long)dist_cache[3])) goto LAB_003179b0;
            goto LAB_003179b4;
          }
          bVar33 = (byte)((int)uVar37 << 2);
          uVar28 = 0xfdb1ace;
        }
        uVar37 = (ulong)(uVar28 >> (bVar33 & 0x1f) & 0xf);
      }
      goto LAB_003179b4;
    }
    uVar37 = 0;
  }
  uVar28 = (uint)local_140;
  local_100->insert_len_ = uVar28;
  local_100->copy_len_ = iVar47 << 0x19 | (uint)uVar30;
  uVar61 = (ulong)(params->dist).num_direct_distance_codes;
  uVar45 = uVar61 + 0x10;
  uVar26 = 0;
  if (uVar45 <= uVar37) {
    uVar44 = (params->dist).distance_postfix_bits;
    bVar33 = (byte)uVar44;
    uVar61 = ((4L << (bVar33 & 0x3f)) + (uVar37 - uVar61)) - 0x10;
    uVar51 = 0x1f;
    uVar27 = (uint)uVar61;
    if (uVar27 != 0) {
      for (; uVar27 >> uVar51 == 0; uVar51 = uVar51 - 1) {
      }
    }
    uVar51 = (uVar51 ^ 0xffffffe0) + 0x1f;
    uVar59 = (ulong)((uVar61 >> ((ulong)uVar51 & 0x3f) & 1) != 0);
    lVar54 = (ulong)uVar51 - (ulong)uVar44;
    uVar37 = (~(-1 << (bVar33 & 0x1f)) & uVar27) + uVar45 +
             (uVar59 + lVar54 * 2 + 0xfffe << (bVar33 & 0x3f)) | lVar54 * 0x400;
    uVar26 = (uint32_t)(uVar61 - (uVar59 + 2 << ((byte)uVar51 & 0x3f)) >> (bVar33 & 0x3f));
  }
  local_100->dist_prefix_ = (uint16_t)uVar37;
  local_100->dist_extra_ = uVar26;
  if (5 < local_140) {
    if (local_140 < 0x82) {
      uVar28 = 0x1f;
      uVar44 = (uint)(local_140 - 2);
      if (uVar44 != 0) {
        for (; uVar44 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar28 = (int)(local_140 - 2 >> ((char)(uVar28 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar28 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_140 < 0x842) {
      uVar44 = 0x1f;
      if (uVar28 - 0x42 != 0) {
        for (; uVar28 - 0x42 >> uVar44 == 0; uVar44 = uVar44 - 1) {
        }
      }
      uVar28 = (uVar44 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar28 = 0x15;
      if (0x1841 < local_140) {
        uVar28 = (uint)(ushort)(0x17 - (local_140 < 0x5842));
      }
    }
  }
  uVar44 = iVar47 + (uint)uVar30;
  if (uVar44 < 10) {
    uVar51 = uVar44 - 2;
  }
  else if (uVar44 < 0x86) {
    uVar44 = uVar44 - 6;
    uVar51 = 0x1f;
    if (uVar44 != 0) {
      for (; uVar44 >> uVar51 == 0; uVar51 = uVar51 - 1) {
      }
    }
    uVar51 = (uVar44 >> ((char)(uVar51 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar51 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar51 = 0x17;
    if (uVar44 < 0x846) {
      uVar51 = 0x1f;
      if (uVar44 - 0x46 != 0) {
        for (; uVar44 - 0x46 >> uVar51 == 0; uVar51 = uVar51 - 1) {
        }
      }
      uVar51 = (uVar51 ^ 0xffe0) + 0x2c;
    }
  }
  uVar8 = (ushort)uVar51;
  uVar43 = (uVar8 & 7) + ((ushort)uVar28 & 7) * 8;
  if ((((uVar37 & 0x3ff) == 0) && ((ushort)uVar28 < 8)) && (uVar8 < 0x10)) {
    if (7 < uVar8) {
      uVar43 = uVar43 + 0x40;
    }
  }
  else {
    iVar25 = ((uVar28 & 0xffff) >> 3) * 3 + ((uVar51 & 0xffff) >> 3);
    uVar43 = uVar43 + ((ushort)(0x520d40 >> ((char)iVar25 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar25 * 0x40 + 0x40;
  }
  local_100->cmd_prefix_ = uVar43;
  *num_literals = *num_literals + local_140;
  position = uVar30 + (long)pvVar48;
  pvVar32 = pvVar34;
  if (position < pvVar34) {
    pvVar32 = (void *)position;
  }
  pvVar53 = (void *)((long)pvVar48 + 2);
  if (local_150 < (void *)(uVar30 >> 2)) {
    pvVar62 = (void *)(position + (long)local_150 * -4);
    if (pvVar62 < pvVar53) {
      pvVar62 = pvVar53;
    }
    pvVar53 = pvVar62;
    if (pvVar32 < pvVar62) {
      pvVar53 = pvVar32;
    }
  }
  pvVar48 = (void *)((long)pvVar48 + uVar30 * 2 + lVar35);
  local_100 = local_100 + 1;
  if (pvVar53 < pvVar32) {
    uVar17 = (hasher->privat)._H6.hash_mul_;
    uVar28 = (hasher->privat)._H6.block_mask_;
    uVar10 = *(undefined4 *)((long)&(hasher->privat)._H35.hb.table + 4);
    do {
      uVar37 = *(long *)(ringbuffer + ((ulong)pvVar53 & ringbuffer_mask)) * uVar17 >> 0x31;
      uVar8 = *(ushort *)((long)puVar13 + uVar37 * 2);
      *(ushort *)((long)puVar13 + uVar37 * 2) = uVar8 + 1;
      puVar14[(uVar37 << ((byte)uVar10 & 0x3f)) + (ulong)(uVar28 & uVar8)] = (uint32_t)pvVar53;
      pvVar53 = (void *)((long)pvVar53 + 1);
    } while (pvVar32 != pvVar53);
    local_140 = 0;
  }
  else {
    local_140 = 0;
  }
LAB_00317d84:
  pvVar32 = (void *)position;
  if (uVar2 <= position + 8) goto LAB_00317e20;
  goto LAB_0031658f;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}